

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impulse.hpp
# Opt level: O2

value_type __thiscall
vista::circular::example::impulse<double,_2UL>::value(impulse<double,_2UL> *this)

{
  circular_view<double,_2UL> *pcVar1;
  uint uVar2;
  double dVar3;
  basic_iterator<const_double> __first1;
  basic_iterator<const_double> __last1;
  
  pcVar1 = &(this->window).super_circular_view<double,_2UL>;
  uVar2 = (uint)(this->window).super_circular_view<double,_2UL>.member.next;
  __first1.current._0_4_ =
       uVar2 - (int)(this->window).super_circular_view<double,_2UL>.member.size & 3;
  __last1.current._0_4_ = uVar2 & 3;
  __first1.parent = pcVar1;
  __first1.current._4_4_ = 0;
  __last1.parent = pcVar1;
  __last1.current._4_4_ = 0;
  dVar3 = std::
          inner_product<vista::circular_view<double,2ul>::basic_iterator<double_const>,double_const*,double>
                    (__first1,__last1,(this->coefficients)._M_elems,0.0);
  return dVar3;
}

Assistant:

value_type value() const
    {
        return std::inner_product(window.begin(),
                                  window.end(),
                                  coefficients.begin(),
                                  value_type{});
    }